

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string_view name,Symbol symbol)

{
  ctrl_t *pcVar1;
  ushort uVar2;
  ushort x;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  char cVar6;
  uint32_t uVar7;
  uint uVar8;
  string *psVar9;
  size_t sVar10;
  SymbolByParentHash *this_00;
  EqualElement<google::protobuf::Symbol> *pEVar11;
  size_t sVar12;
  ctrl_t *pcVar13;
  slot_type *psVar14;
  size_type sVar15;
  Symbol *ts;
  Symbol *ts_00;
  ulong extraout_RDX;
  Symbol *ts_01;
  ulong extraout_RDX_00;
  Symbol *ts_02;
  undefined8 uVar16;
  SymbolByParentHash *pSVar17;
  Symbol *s;
  pointer pcVar18;
  ushort uVar19;
  ulong uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i match;
  ctrl_t cVar24;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  FindInfo FVar42;
  iterator iVar43;
  iterator iVar44;
  probe_seq<16UL> seq;
  Symbol symbol_local;
  iterator local_a8;
  undefined8 local_98;
  ctrl_t cStack_90;
  ctrl_t cStack_8f;
  ctrl_t cStack_8e;
  ctrl_t cStack_8d;
  ctrl_t cStack_8c;
  ctrl_t cStack_8b;
  ctrl_t cStack_8a;
  ctrl_t cStack_89;
  undefined1 local_88 [16];
  void *parent_local;
  ctrl_t local_68;
  ctrl_t cStack_67;
  ctrl_t cStack_66;
  ctrl_t cStack_65;
  ctrl_t cStack_64;
  ctrl_t cStack_63;
  ctrl_t cStack_62;
  ctrl_t cStack_61;
  ctrl_t cStack_60;
  ctrl_t cStack_5f;
  ctrl_t cStack_5e;
  ctrl_t cStack_5d;
  ctrl_t cStack_5c;
  ctrl_t cStack_5b;
  ctrl_t cStack_5a;
  ctrl_t cStack_59;
  string_view name_local;
  iterator local_40;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  symbol_local = symbol;
  parent_local = parent;
  Symbol::parent_name_key
            ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)&seq,
             &symbol_local);
  psVar9 = absl::lts_20240722::log_internal::
           Check_EQImpl<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                     (&name_local,(basic_string_view<char,_std::char_traits<char>_> *)&seq.offset_,
                      "name == symbol.parent_name_key().second");
  if (psVar9 == (string *)0x0) {
    Symbol::parent_name_key
              ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)&seq,
               &symbol_local);
    psVar9 = absl::lts_20240722::log_internal::Check_EQImpl<void_const*,void_const*>
                       (&parent_local,(void **)&seq,"parent == symbol.parent_name_key().first");
    if (psVar9 == (string *)0x0) {
      pSVar17 = (SymbolByParentHash *)&symbol_local;
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,&symbol_local);
      bVar5 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
      if (bVar5) {
        if ((this->symbols_by_parent_).
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            size_ < 2) {
          bVar5 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)this);
          if (!bVar5) {
            __assert_fail("is_soo()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xdc5,
                          "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                         );
          }
          absl::lts_20240722::container_internal::CommonFields::set_full_soo((CommonFields *)this);
          iVar43 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                   *)this);
        }
        else {
          seq.offset_ = (size_t)this;
          seq.mask_ = (size_t)&symbol_local;
          pEVar11 = (EqualElement<google::protobuf::Symbol> *)
                    absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          bVar5 = absl::lts_20240722::container_internal::
                  hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                  ::
                  apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                            ((hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                              *)&seq,pEVar11,ts_00);
          if (bVar5) {
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)this);
            return false;
          }
          s = (Symbol *)0x3;
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::resize_impl(this);
          sVar12 = (anonymous_namespace)::SymbolByParentHash::operator()
                             ((SymbolByParentHash *)&symbol_local,s);
          sVar12 = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                             (sVar12,8,(CommonFields *)this);
          iVar43 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                  *)this,sVar12);
        }
      }
      else {
        bVar5 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this);
        if (bVar5) {
          __assert_fail("!is_soo()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xede,
                        "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        sVar12 = (anonymous_namespace)::SymbolByParentHash::operator()
                           ((SymbolByParentHash *)&symbol_local,(Symbol *)pSVar17);
        absl::lts_20240722::container_internal::probe(&seq,(CommonFields *)this,sVar12);
        pcVar13 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                             *)this);
        auVar22 = ZEXT216(CONCAT11((char)sVar12,(char)sVar12) & 0x7f7f);
        auVar22 = pshuflw(auVar22,auVar22,0);
        uVar21 = auVar22._0_4_;
        local_88._4_4_ = uVar21;
        local_88._0_4_ = uVar21;
        local_88._8_4_ = uVar21;
        local_88._12_4_ = uVar21;
        while( true ) {
          pcVar1 = pcVar13 + seq.offset_;
          auVar22[0] = -(local_88[0] == *pcVar1);
          auVar22[1] = -(local_88[1] == pcVar1[1]);
          auVar22[2] = -(local_88[2] == pcVar1[2]);
          auVar22[3] = -(local_88[3] == pcVar1[3]);
          auVar22[4] = -(local_88[4] == pcVar1[4]);
          auVar22[5] = -(local_88[5] == pcVar1[5]);
          auVar22[6] = -(local_88[6] == pcVar1[6]);
          auVar22[7] = -(local_88[7] == pcVar1[7]);
          auVar22[8] = -(local_88[8] == pcVar1[8]);
          auVar22[9] = -(local_88[9] == pcVar1[9]);
          auVar22[10] = -(local_88[10] == pcVar1[10]);
          auVar22[0xb] = -(local_88[0xb] == pcVar1[0xb]);
          auVar22[0xc] = -(local_88[0xc] == pcVar1[0xc]);
          auVar22[0xd] = -(local_88[0xd] == pcVar1[0xd]);
          auVar22[0xe] = -(local_88[0xe] == pcVar1[0xe]);
          auVar22[0xf] = -(local_88[0xf] == pcVar1[0xf]);
          cVar24 = *pcVar1;
          cVar27 = pcVar1[1];
          cVar28 = pcVar1[2];
          cVar29 = pcVar1[3];
          cVar30 = pcVar1[4];
          cVar31 = pcVar1[5];
          cVar32 = pcVar1[6];
          cVar33 = pcVar1[7];
          cVar34 = pcVar1[8];
          cVar35 = pcVar1[9];
          cVar36 = pcVar1[10];
          cVar37 = pcVar1[0xb];
          cVar38 = pcVar1[0xc];
          cVar39 = pcVar1[0xd];
          cVar40 = pcVar1[0xe];
          cVar41 = pcVar1[0xf];
          for (uVar19 = (ushort)(SUB161(auVar22 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar22[0xf] >> 7) << 0xf; uVar19 != 0;
              uVar19 = uVar19 - 1 & uVar19) {
            local_98 = (ctrl_t *)
                       CONCAT17(cVar33,CONCAT16(cVar32,CONCAT15(cVar31,CONCAT14(cVar30,CONCAT13(
                                                  cVar29,CONCAT12(cVar28,CONCAT11(cVar27,cVar24)))))
                                               ));
            cStack_90 = cVar34;
            cStack_8f = cVar35;
            cStack_8e = cVar36;
            cStack_8d = cVar37;
            cStack_8c = cVar38;
            cStack_8b = cVar39;
            cStack_8a = cVar40;
            cStack_89 = cVar41;
            uVar7 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar19);
            local_a8.field_1.slot_ = (slot_type *)this;
            local_a8.ctrl_ = (ctrl_t *)&symbol_local;
            psVar14 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this);
            bVar5 = absl::lts_20240722::container_internal::
                    hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                    ::
                    apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                              ((hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                                *)&local_a8,
                               (EqualElement<google::protobuf::Symbol> *)
                               (psVar14 + (seq.offset_ + uVar7 & seq.mask_)),ts);
            if (bVar5) {
              sVar12 = uVar7 + seq.offset_ & seq.mask_;
              goto LAB_001bc101;
            }
            cVar24 = (ctrl_t)local_98;
            cVar27 = local_98._1_1_;
            cVar28 = local_98._2_1_;
            cVar29 = local_98._3_1_;
            cVar30 = local_98._4_1_;
            cVar31 = local_98._5_1_;
            cVar32 = local_98._6_1_;
            cVar33 = local_98._7_1_;
            cVar34 = cStack_90;
            cVar35 = cStack_8f;
            cVar36 = cStack_8e;
            cVar37 = cStack_8d;
            cVar38 = cStack_8c;
            cVar39 = cStack_8b;
            cVar40 = cStack_8a;
            cVar41 = cStack_89;
          }
          auVar25[0] = -(cVar24 == kEmpty);
          auVar25[1] = -(cVar27 == kEmpty);
          auVar25[2] = -(cVar28 == kEmpty);
          auVar25[3] = -(cVar29 == kEmpty);
          auVar25[4] = -(cVar30 == kEmpty);
          auVar25[5] = -(cVar31 == kEmpty);
          auVar25[6] = -(cVar32 == kEmpty);
          auVar25[7] = -(cVar33 == kEmpty);
          auVar25[8] = -(cVar34 == kEmpty);
          auVar25[9] = -(cVar35 == kEmpty);
          auVar25[10] = -(cVar36 == kEmpty);
          auVar25[0xb] = -(cVar37 == kEmpty);
          auVar25[0xc] = -(cVar38 == kEmpty);
          auVar25[0xd] = -(cVar39 == kEmpty);
          auVar25[0xe] = -(cVar40 == kEmpty);
          auVar25[0xf] = -(cVar41 == kEmpty);
          x = (ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf;
          if (x != 0) break;
          uVar20 = seq.index_ + 0x10;
          seq.offset_ = seq.offset_ + uVar20 & seq.mask_;
          seq.index_ = uVar20;
          sVar10 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this);
          if (sVar10 < uVar20) {
            __assert_fail("seq.index() <= capacity() && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xef5,
                          "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                         );
          }
        }
        sVar10 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                             *)this);
        pcVar13 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                             *)this);
        cVar6 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                          (sVar10,sVar12,pcVar13);
        if (cVar6 == '\0') {
          uVar8 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(x);
        }
        else {
          uVar2 = 0xf;
          if (x != 0) {
            for (; x >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          uVar8 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
        }
        FVar42.offset = uVar8 + seq.offset_ & seq.mask_;
        FVar42.probe_length = seq.index_;
        sVar12 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                           ((CommonFields *)this,sVar12,FVar42,
                            (PolicyFunctions *)
                            absl::lts_20240722::container_internal::
                            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>
                            ::GetPolicyFunctions()::value);
LAB_001bc101:
        iVar43 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this,sVar12);
        if (uVar19 != 0) {
          return false;
        }
      }
      (iVar43.field_1.slot_)->ptr_ = symbol_local.ptr_;
      local_40 = iVar43;
      this_00 = (SymbolByParentHash *)
                absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::iterator::operator*(&local_40);
      pSVar17 = this_00;
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,(Symbol *)this_00);
      bVar5 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        *)this);
      if (bVar5) {
        bVar5 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this);
        if (!bVar5) {
          __assert_fail("is_soo()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xda7,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
        uVar20 = extraout_RDX;
        if (1 < (this->symbols_by_parent_).
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.size_) {
          seq.offset_ = (size_t)this;
          seq.mask_ = (size_t)this_00;
          pEVar11 = (EqualElement<google::protobuf::Symbol> *)
                    absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          bVar5 = absl::lts_20240722::container_internal::
                  hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                  ::
                  apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                            ((hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                              *)&seq,pEVar11,ts_01);
          uVar20 = extraout_RDX_00;
          if (bVar5) {
            iVar44 = absl::lts_20240722::container_internal::
                     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     ::soo_iterator((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                     *)this);
            goto LAB_001bc3b5;
          }
        }
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar20;
        iVar44 = (iterator)(auVar3 << 0x40);
      }
      else {
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)this);
        sVar12 = (anonymous_namespace)::SymbolByParentHash::operator()(this_00,(Symbol *)pSVar17);
        bVar5 = absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::is_soo((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)this);
        if (bVar5) {
          __assert_fail("!is_soo()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xdb0,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
        absl::lts_20240722::container_internal::probe(&seq,(CommonFields *)this,sVar12);
        pcVar13 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::control((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                             *)this);
        auVar22 = ZEXT216(CONCAT11((char)sVar12,(char)sVar12) & 0x7f7f);
        auVar22 = pshuflw(auVar22,auVar22,0);
        uVar21 = auVar22._0_4_;
        local_88._4_4_ = uVar21;
        local_88._0_4_ = uVar21;
        local_88._8_4_ = uVar21;
        local_88._12_4_ = uVar21;
        while( true ) {
          pcVar1 = pcVar13 + seq.offset_;
          auVar23[0] = -(local_88[0] == *pcVar1);
          auVar23[1] = -(local_88[1] == pcVar1[1]);
          auVar23[2] = -(local_88[2] == pcVar1[2]);
          auVar23[3] = -(local_88[3] == pcVar1[3]);
          auVar23[4] = -(local_88[4] == pcVar1[4]);
          auVar23[5] = -(local_88[5] == pcVar1[5]);
          auVar23[6] = -(local_88[6] == pcVar1[6]);
          auVar23[7] = -(local_88[7] == pcVar1[7]);
          auVar23[8] = -(local_88[8] == pcVar1[8]);
          auVar23[9] = -(local_88[9] == pcVar1[9]);
          auVar23[10] = -(local_88[10] == pcVar1[10]);
          auVar23[0xb] = -(local_88[0xb] == pcVar1[0xb]);
          auVar23[0xc] = -(local_88[0xc] == pcVar1[0xc]);
          auVar23[0xd] = -(local_88[0xd] == pcVar1[0xd]);
          auVar23[0xe] = -(local_88[0xe] == pcVar1[0xe]);
          auVar23[0xf] = -(local_88[0xf] == pcVar1[0xf]);
          cVar24 = *pcVar1;
          cVar27 = pcVar1[1];
          cVar28 = pcVar1[2];
          cVar29 = pcVar1[3];
          cVar30 = pcVar1[4];
          cVar31 = pcVar1[5];
          cVar32 = pcVar1[6];
          cVar33 = pcVar1[7];
          cVar34 = pcVar1[8];
          cVar35 = pcVar1[9];
          cVar36 = pcVar1[10];
          cVar37 = pcVar1[0xb];
          cVar38 = pcVar1[0xc];
          cVar39 = pcVar1[0xd];
          cVar40 = pcVar1[0xe];
          cVar41 = pcVar1[0xf];
          for (uVar19 = (ushort)(SUB161(auVar23 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar23[0xf] >> 7) << 0xf; auVar4._8_8_ = 0, auVar4._0_8_ = pcVar13
              , iVar44 = (iterator)(auVar4 << 0x40), uVar19 != 0; uVar19 = uVar19 - 1 & uVar19) {
            local_98 = pcVar13;
            local_68 = cVar24;
            cStack_67 = cVar27;
            cStack_66 = cVar28;
            cStack_65 = cVar29;
            cStack_64 = cVar30;
            cStack_63 = cVar31;
            cStack_62 = cVar32;
            cStack_61 = cVar33;
            cStack_60 = cVar34;
            cStack_5f = cVar35;
            cStack_5e = cVar36;
            cStack_5d = cVar37;
            cStack_5c = cVar38;
            cStack_5b = cVar39;
            cStack_5a = cVar40;
            cStack_59 = cVar41;
            uVar7 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar19);
            local_a8.field_1.slot_ = (slot_type *)this;
            local_a8.ctrl_ = (ctrl_t *)this_00;
            psVar14 = absl::lts_20240722::container_internal::
                      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                    *)this);
            bVar5 = absl::lts_20240722::container_internal::
                    hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                    ::
                    apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                              ((hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                                *)&local_a8,
                               (EqualElement<google::protobuf::Symbol> *)
                               (psVar14 + (seq.offset_ + uVar7 & seq.mask_)),ts_02);
            if (bVar5) {
              iVar44 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                      *)this,uVar7 + seq.offset_ & seq.mask_);
              goto LAB_001bc3b5;
            }
            pcVar13 = local_98;
            cVar24 = local_68;
            cVar27 = cStack_67;
            cVar28 = cStack_66;
            cVar29 = cStack_65;
            cVar30 = cStack_64;
            cVar31 = cStack_63;
            cVar32 = cStack_62;
            cVar33 = cStack_61;
            cVar34 = cStack_60;
            cVar35 = cStack_5f;
            cVar36 = cStack_5e;
            cVar37 = cStack_5d;
            cVar38 = cStack_5c;
            cVar39 = cStack_5b;
            cVar40 = cStack_5a;
            cVar41 = cStack_59;
          }
          auVar26[0] = -(cVar24 == kEmpty);
          auVar26[1] = -(cVar27 == kEmpty);
          auVar26[2] = -(cVar28 == kEmpty);
          auVar26[3] = -(cVar29 == kEmpty);
          auVar26[4] = -(cVar30 == kEmpty);
          auVar26[5] = -(cVar31 == kEmpty);
          auVar26[6] = -(cVar32 == kEmpty);
          auVar26[7] = -(cVar33 == kEmpty);
          auVar26[8] = -(cVar34 == kEmpty);
          auVar26[9] = -(cVar35 == kEmpty);
          auVar26[10] = -(cVar36 == kEmpty);
          auVar26[0xb] = -(cVar37 == kEmpty);
          auVar26[0xc] = -(cVar38 == kEmpty);
          auVar26[0xd] = -(cVar39 == kEmpty);
          auVar26[0xe] = -(cVar40 == kEmpty);
          auVar26[0xf] = -(cVar41 == kEmpty);
          if ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar26 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar26 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar26 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar26 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar26 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar26 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar26 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar26 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cVar41 == kEmpty) break;
          uVar20 = seq.index_ + 0x10;
          seq.offset_ = seq.offset_ + uVar20 & seq.mask_;
          seq.index_ = uVar20;
          sVar12 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   ::capacity((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this);
          if (sVar12 < uVar20) {
            __assert_fail("seq.index() <= capacity() && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xdbd,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                         );
          }
        }
      }
LAB_001bc3b5:
      seq._0_16_ = iVar44;
      local_a8 = iVar43;
      bVar5 = absl::lts_20240722::container_internal::operator==
                        ((const_iterator *)&seq,(const_iterator *)&local_a8);
      if (!bVar5) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf3f,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                     );
      }
      return true;
    }
    pcVar18 = (psVar9->_M_dataplus)._M_p;
    sVar15 = psVar9->_M_string_length;
    uVar16 = 0x797;
  }
  else {
    pcVar18 = (psVar9->_M_dataplus)._M_p;
    sVar15 = psVar9->_M_string_length;
    uVar16 = 0x796;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&seq,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
             ,uVar16,sVar15,pcVar18);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&seq);
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               absl::string_view name,
                                               Symbol symbol) {
  ABSL_DCHECK_EQ(name, symbol.parent_name_key().second);
  ABSL_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}